

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O1

void __thiscall
ArgWrapper<char>::ArgWrapper<char_const*,char_const*>
          (ArgWrapper<char> *this,char *in_args,char *in_args_1)

{
  long lVar1;
  long *plVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [16];
  long local_38 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,in_args,&local_81);
  std::__cxx11::string::string<std::allocator<char>>(local_48,in_args_1,&local_82);
  __l._M_len = 2;
  __l._M_array = &local_68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_80,__l,&local_83);
  ArgWrapper(this,&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  lVar1 = -0x40;
  plVar2 = local_38;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  return;
}

Assistant:

ArgWrapper(Args... in_args)
		: ArgWrapper{ std::vector<std::basic_string<CharT>>{ in_args... } } {
		// Empty ctor body
	}